

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sturm.cpp
# Opt level: O1

void __thiscall
opengv::math::Sturm::bracketRoots
          (Sturm *this,vector<double,_std::allocator<double>_> *roots,double eps)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator __position;
  undefined1 auVar1 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  Bracket *pBVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  size_t sVar7;
  _List_node_base *p_Var8;
  _Self __tmp;
  undefined1 auVar9 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 in_XMM2 [16];
  list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  stack;
  Bracket *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  double local_68;
  _List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  local_60;
  double local_48;
  undefined8 uStack_40;
  
  local_68 = eps;
  local_48 = computeLagrangianBound(this);
  local_60._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_60;
  local_60._M_impl._M_node._M_size = 0;
  local_60._M_impl._M_node.super__List_node_base._M_prev =
       local_60._M_impl._M_node.super__List_node_base._M_next;
  uStack_40 = extraout_XMM0_Qb;
  pBVar4 = (Bracket *)operator_new(0x30);
  auVar1._8_8_ = uStack_40;
  auVar1._0_8_ = local_48;
  auVar9._8_8_ = 0x8000000000000000;
  auVar9._0_8_ = 0x8000000000000000;
  auVar9 = vxorpd_avx512vl(auVar1,auVar9);
  Bracket::Bracket(pBVar4,auVar9._0_8_,local_48);
  local_78 = pBVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<opengv::math::Bracket*>
            (&_Stack_70,pBVar4);
  p_Var5 = (_List_node_base *)operator_new(0x20);
  _Var2._M_pi = _Stack_70._M_pi;
  p_Var5[1]._M_prev = (_List_node_base *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var5[1]._M_next = (_List_node_base *)local_78;
  p_Var5[1]._M_prev = (_List_node_base *)_Var2._M_pi;
  local_78 = (Bracket *)0x0;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  local_60._M_impl._M_node._M_size = local_60._M_impl._M_node._M_size + 1;
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  p_Var5 = local_60._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  p_Var6 = (_List_node_base *)evaluateChain2(this,(double)p_Var5->_M_prev);
  p_Var5[2]._M_next = p_Var6;
  *(undefined1 *)&p_Var5[1]._M_prev = 1;
  p_Var5 = local_60._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
  p_Var6 = (_List_node_base *)evaluateChain2(this,(double)p_Var5[1]._M_next);
  p_Var5[2]._M_prev = p_Var6;
  *(undefined1 *)((long)&p_Var5[1]._M_prev + 1) = 1;
  if (local_68 < 0.0) {
    sVar7 = Bracket::numberRoots
                      ((Bracket *)local_60._M_impl._M_node.super__List_node_base._M_prev[1]._M_next)
    ;
    auVar9 = vcvtusi2sd_avx512f(in_XMM2,sVar7);
    local_68 = local_48 / (auVar9._0_8_ * 10.0);
  }
  sVar7 = Bracket::numberRoots
                    ((Bracket *)local_60._M_impl._M_node.super__List_node_base._M_prev[1]._M_next);
  std::vector<double,_std::allocator<double>_>::reserve(roots,sVar7);
  while (local_60._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_60) {
    pBVar4 = (Bracket *)local_60._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_60._M_impl._M_node.super__List_node_base._M_next[1]._M_prev;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    std::__cxx11::
    list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
    ::_M_erase((list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                *)&local_60,(iterator)local_60._M_impl._M_node.super__List_node_base._M_next);
    bVar3 = Bracket::dividable(pBVar4,local_68);
    if (bVar3) {
      Bracket::divide(pBVar4,(list<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
                              *)&local_60);
      p_Var6 = local_60._M_impl._M_node.super__List_node_base._M_prev;
      p_Var8 = (_List_node_base *)
               evaluateChain2(this,(double)(local_60._M_impl._M_node.super__List_node_base._M_prev
                                            [1]._M_next)->_M_prev);
      p_Var5 = p_Var6[1]._M_next;
      p_Var5[2]._M_next = p_Var8;
      *(undefined1 *)&p_Var5[1]._M_prev = 1;
      p_Var5 = p_Var6->_M_prev[1]._M_next;
      p_Var5[2]._M_prev = p_Var8;
      *(undefined1 *)((long)&p_Var5[1]._M_prev + 1) = 1;
    }
    else {
      sVar7 = Bracket::numberRoots(pBVar4);
      if (sVar7 != 0) {
        local_78 = (Bracket *)((pBVar4->_lowerBound + pBVar4->_upperBound) * 0.5);
        __position._M_current =
             (roots->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (roots->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (roots,__position,(double *)&local_78);
        }
        else {
          *__position._M_current = (double)local_78;
          (roots->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  std::__cxx11::
  _List_base<std::shared_ptr<opengv::math::Bracket>,_std::allocator<std::shared_ptr<opengv::math::Bracket>_>_>
  ::_M_clear(&local_60);
  return;
}

Assistant:

void
opengv::math::Sturm::bracketRoots( std::vector<double> & roots, double eps )
{
  double absoluteBound = computeLagrangianBound();
  std::list<Bracket::Ptr> stack;
  stack.push_back(Bracket::Ptr(new Bracket(-absoluteBound,absoluteBound)));
  stack.back()->setLowerBoundChanges( evaluateChain2(stack.back()->lowerBound()) );
  stack.back()->setUpperBoundChanges( evaluateChain2(stack.back()->upperBound()) );
  
  double localEps = eps;
  if( eps < 0.0 )
    localEps = absoluteBound / (10.0 * stack.back()->numberRoots());
  roots.reserve(stack.back()->numberRoots());
  
  while( !stack.empty() )
  {  
    Bracket::Ptr bracket = stack.front();
    stack.pop_front();
    
    if( bracket->dividable( localEps) )
    {
      bracket->divide(stack);
      std::list<Bracket::Ptr>::iterator it = stack.end();
      it--;
      size_t changes = evaluateChain2((*it)->lowerBound());
      (*it)->setLowerBoundChanges(changes);
      it--;
      (*it)->setUpperBoundChanges(changes);
    }
    else
    {
      if( bracket->numberRoots() > 0 )
        roots.push_back(0.5 * (bracket->lowerBound() + bracket->upperBound()));
    }
  }
}